

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

String * kj::getCaughtExceptionType(void)

{
  long lVar1;
  char *__ptr;
  String *in_RDI;
  char *value;
  int status;
  undefined1 local_3c [4];
  Array<char> local_38;
  
  lVar1 = __cxa_current_exception_type();
  value = *(char **)(lVar1 + 8) + (**(char **)(lVar1 + 8) == '*');
  __ptr = (char *)__cxa_demangle(value,0,0,local_3c);
  if (__ptr != (char *)0x0) {
    value = __ptr;
  }
  heapString((String *)&local_38,value);
  free(__ptr);
  (in_RDI->content).ptr = local_38.ptr;
  (in_RDI->content).size_ = local_38.size_;
  (in_RDI->content).disposer = local_38.disposer;
  local_38.ptr = (char *)0x0;
  local_38.size_ = 0;
  Array<char>::~Array(&local_38);
  return in_RDI;
}

Assistant:

kj::String getCaughtExceptionType() {
  return demangleTypeName(abi::__cxa_current_exception_type()->name());
}